

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O3

Rect __thiscall nite::Rect::operator-(Rect *this,float c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *in_RDI;
  undefined4 in_XMM0_Db;
  Rect RVar4;
  
  RVar4.y = (float)in_XMM0_Db;
  RVar4.x = c;
  fVar1 = this->y;
  fVar2 = this->w;
  fVar3 = this->h;
  RVar4.w = this->x - c;
  *in_RDI = RVar4.w;
  in_RDI[1] = fVar1 - c;
  in_RDI[2] = fVar2 - c;
  in_RDI[3] = fVar3 - c;
  RVar4.h = 0.0;
  return RVar4;
}

Assistant:

nite::Rect nite::Rect::operator-(float c){
	Rect R = *this;
	R.x -= c;
	R.y -= c;
	R.w -= c;
	R.h -= c;
	return R;
}